

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

size_type __thiscall Catch::StringRef::numberOfCharacters(StringRef *this)

{
  char cVar1;
  size_type sVar2;
  char c;
  size_type i;
  size_type noChars;
  StringRef *this_local;
  
  noChars = this->m_size;
  for (i = 0; i < this->m_size; i = i + 1) {
    cVar1 = this->m_start[i];
    if (((int)cVar1 & 0xc0U) == 0xc0) {
      sVar2 = noChars - 1;
      if (((int)cVar1 & 0xe0U) == 0xe0) {
        sVar2 = noChars - 2;
      }
      noChars = sVar2;
      if (((int)cVar1 & 0xf0U) == 0xf0) {
        noChars = noChars - 1;
      }
    }
  }
  return noChars;
}

Assistant:

auto StringRef::numberOfCharacters() const noexcept -> size_type {
        size_type noChars = m_size;
        // Make adjustments for uft encodings
        for( size_type i=0; i < m_size; ++i ) {
            char c = m_start[i];
            if( ( c & byte_2_lead ) == byte_2_lead ) {
                noChars--;
                if (( c & byte_3_lead ) == byte_3_lead )
                    noChars--;
                if( ( c & byte_4_lead ) == byte_4_lead )
                    noChars--;
            }
        }
        return noChars;
    }